

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_2;
  NameValuePragmaExpressionSyntax *pNVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_41;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x38),&local_41,(BumpAllocator *)__child_stack);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NameValuePragmaExpressionSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::PragmaExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,&local_30,&local_40,
                      (PragmaExpressionSyntax *)args_2);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NameValuePragmaExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NameValuePragmaExpressionSyntax>(
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        *deepClone<PragmaExpressionSyntax>(*node.value, alloc)
    );
}